

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O3

void __thiscall
CVmObjIterIdx::CVmObjIterIdx
          (CVmObjIterIdx *this,vm_val_t *coll,long first_valid_index,long last_valid_index)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  uint32_t tmp_1;
  uint32_t tmp;
  
  (this->super_CVmObjIter).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_00366900;
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x15,this);
  (this->super_CVmObjIter).super_CVmObject.ext_ = (char *)CONCAT44(extraout_var,iVar2);
  vmb_put_dh((char *)CONCAT44(extraout_var,iVar2),coll);
  *(int *)((this->super_CVmObjIter).super_CVmObject.ext_ + 5) = (int)first_valid_index + -1;
  *(int *)((this->super_CVmObjIter).super_CVmObject.ext_ + 9) = (int)first_valid_index;
  *(int *)((this->super_CVmObjIter).super_CVmObject.ext_ + 0xd) = (int)last_valid_index;
  pcVar1 = (this->super_CVmObjIter).super_CVmObject.ext_;
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  return;
}

Assistant:

CVmObjIterIdx::CVmObjIterIdx(VMG_ const vm_val_t *coll,
                             long first_valid_index, long last_valid_index)
{
    /* allocate space for our extension data */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(VMOBJITERIDX_EXT_SIZE, this);

    /* save the collection value */
    vmb_put_dh(ext_, coll);

    /* 
     *   set the current index to the first index minus 1, so that we start
     *   with the first element when we make our first call to getNext() 
     */
    set_cur_index_no_undo(first_valid_index - 1);

    /* remember the first and last valid index values */
    set_first_valid(first_valid_index);
    set_last_valid(last_valid_index);

    /* clear the flags */
    set_flags(0);
}